

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScenePrivate::setScenePosItemEnabled
          (QGraphicsScenePrivate *this,QGraphicsItem *item,bool enabled)

{
  byte bVar1;
  byte bVar2;
  QGraphicsItemPrivate *pQVar3;
  byte in_DL;
  long in_RSI;
  QGraphicsScenePrivate *in_RDI;
  QGraphicsItem *p;
  QGraphicsItem *member;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1 = in_DL & 1;
  pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)(in_RSI + 8));
  member = pQVar3->parent;
  while (member != (QGraphicsItem *)0x0) {
    bVar2 = bVar1 & 1;
    pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&member->d_ptr);
    *(uint *)&pQVar3->field_0x168 = *(uint *)&pQVar3->field_0x168 & 0xffffff7f | (uint)bVar2 << 7;
    pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&member->d_ptr);
    member = pQVar3->parent;
  }
  if (((bVar1 & 1) == 0) && ((*(uint *)&in_RDI->field_0xb8 >> 8 & 1) == 0)) {
    *(uint *)&in_RDI->field_0xb8 = *(uint *)&in_RDI->field_0xb8 & 0xfffffeff | 0x100;
    q_func(in_RDI);
    QMetaObject::invokeMethod<>
              ((QObject *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),(char *)member,
               (ConnectionType)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::setScenePosItemEnabled(QGraphicsItem *item, bool enabled)
{
    QGraphicsItem *p = item->d_ptr->parent;
    while (p) {
        p->d_ptr->scenePosDescendants = enabled;
        p = p->d_ptr->parent;
    }
    if (!enabled && !scenePosDescendantsUpdatePending) {
        scenePosDescendantsUpdatePending = true;
        QMetaObject::invokeMethod(q_func(), "_q_updateScenePosDescendants", Qt::QueuedConnection);
    }
}